

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adynarray.c
# Opt level: O0

bool private_ACUtils_ADynArray_prepareInsertion
               (void *dynArray,size_t index,size_t valueCount,size_t typeSize)

{
  bool bVar1;
  private_ACUtils_DynArray_Prototype *prototype;
  size_t typeSize_local;
  size_t valueCount_local;
  size_t index_local;
  void *dynArray_local;
  
  if ((dynArray == (void *)0x0) || (valueCount == 0)) {
    dynArray_local._4_4_ = (bool)(valueCount == 0);
  }
  else {
    if (index < *(ulong *)((long)dynArray + 0x18)) {
      bVar1 = private_ACUtils_DynArray_shiftElements(dynArray,index,valueCount,typeSize);
      if (bVar1 == false) {
        return false;
      }
    }
    else {
      bVar1 = private_ACUtils_ADynArray_reserve
                        (dynArray,*(long *)((long)dynArray + 0x18) + valueCount,false,typeSize);
      if (bVar1 == false) {
        return false;
      }
    }
    *(size_t *)((long)dynArray + 0x18) = valueCount + *(long *)((long)dynArray + 0x18);
    dynArray_local._4_4_ = true;
  }
  return dynArray_local._4_4_;
}

Assistant:

ACUTILS_HD_FUNC bool private_ACUtils_ADynArray_prepareInsertion(void* dynArray, size_t index, size_t valueCount, size_t typeSize)
{
    if(dynArray != NULL && valueCount > 0) {
        struct private_ACUtils_DynArray_Prototype* prototype = (struct private_ACUtils_DynArray_Prototype*) dynArray;
        if(index >= prototype->size) {
            if(!private_ACUtils_ADynArray_reserve(dynArray, prototype->size + valueCount, false, typeSize))
                return false;
        } else if(!private_ACUtils_DynArray_shiftElements(dynArray, index, valueCount, typeSize)) {
            return false;
        }
        prototype->size += valueCount;
        return true;
    }
    return valueCount == 0;
}